

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlReaderForDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  int size;
  int len;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *cur_local;
  
  if (cur == (xmlChar *)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    size = xmlStrlen(cur);
    cur_local = (xmlChar *)xmlReaderForMemory((char *)cur,size,URL,encoding,options);
  }
  return (xmlTextReaderPtr)cur_local;
}

Assistant:

xmlTextReaderPtr
xmlReaderForDoc(const xmlChar * cur, const char *URL, const char *encoding,
                int options)
{
    int len;

    if (cur == NULL)
        return (NULL);
    len = xmlStrlen(cur);

    return (xmlReaderForMemory
            ((const char *) cur, len, URL, encoding, options));
}